

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

void __thiscall
QAbstractProxyModel::setSourceModel(QAbstractProxyModel *this,QAbstractItemModel *sourceModel)

{
  QAbstractProxyModelPrivate *pQVar1;
  sockaddr *psVar2;
  sockaddr *psVar3;
  QAbstractItemModel *v;
  sockaddr *in_RSI;
  long in_FS_OFFSET;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *unaff_retaddr;
  anon_struct_16_2_8228a70f *c_1;
  anon_struct_16_2_8228a70f *__end3_1;
  anon_struct_16_2_8228a70f *__begin3_1;
  anon_struct_16_2_8228a70f (*__range3_1) [7];
  anon_struct_16_2_8228a70f *c;
  anon_struct_16_2_8228a70f *__end3;
  anon_struct_16_2_8228a70f *__begin3;
  anon_struct_16_2_8228a70f (*__range3) [7];
  QAbstractItemModel *currentModel;
  QAbstractProxyModelPrivate *d;
  char *in_stack_000000c8;
  QObject *in_stack_000000d0;
  char *in_stack_000000d8;
  QObject *in_stack_000000e0;
  sockaddr *in_stack_ffffffffffffff80;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *in_stack_ffffffffffffff90;
  anon_struct_16_2_8228a70f *local_60;
  anon_struct_16_2_8228a70f *local_40;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QAbstractProxyModel *)0x852605);
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::removeBindingUnlessInWrapper(in_stack_ffffffffffffff90);
  psVar2 = (sockaddr *)
           QPropertyData<QAbstractItemModel_*>::valueBypassingBindings
                     (&(pQVar1->model).super_QPropertyData<QAbstractItemModel_*>);
  if (((in_RSI != (sockaddr *)0x0) ||
      (in_stack_ffffffffffffff80 = psVar2,
      psVar3 = (sockaddr *)QAbstractItemModelPrivate::staticEmptyModel(),
      in_stack_ffffffffffffff80 != psVar3)) && (in_RSI != psVar2)) {
    if (psVar2 != (sockaddr *)0x0) {
      for (local_40 = setSourceModel::connectionTable;
          local_40 !=
          (anon_struct_16_2_8228a70f *)
          &
          qt_staticMetaObjectRelocatingContent<(anonymous_namespace)::qt_meta_tag_ZN19QAbstractProxyModelE_t>
          ; local_40 = local_40 + 1) {
        QObject::disconnect(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8)
        ;
      }
    }
    if (in_RSI == (sockaddr *)0x0) {
      v = QAbstractItemModelPrivate::staticEmptyModel();
      QPropertyData<QAbstractItemModel_*>::setValueBypassingBindings
                (&(pQVar1->model).super_QPropertyData<QAbstractItemModel_*>,v);
    }
    else {
      QPropertyData<QAbstractItemModel_*>::setValueBypassingBindings
                (&(pQVar1->model).super_QPropertyData<QAbstractItemModel_*>,(parameter_type)in_RSI);
      for (local_60 = setSourceModel::connectionTable;
          local_60 !=
          (anon_struct_16_2_8228a70f *)
          &
          qt_staticMetaObjectRelocatingContent<(anonymous_namespace)::qt_meta_tag_ZN19QAbstractProxyModelE_t>
          ; local_60 = local_60 + 1) {
        QObject::connect((int)local_10,in_RSI,(socklen_t)(QMetaTypeInterface *)local_60->signalName)
        ;
        QMetaObject::Connection::~Connection((Connection *)in_stack_ffffffffffffff80);
      }
    }
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::notify(unaff_retaddr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractProxyModel::setSourceModel(QAbstractItemModel *sourceModel)
{
    Q_D(QAbstractProxyModel);
    d->model.removeBindingUnlessInWrapper();
    // Special case to handle nullptr models. Otherwise we will have unwanted
    // notifications.
    const QAbstractItemModel *currentModel = d->model.valueBypassingBindings();
    if (!sourceModel && currentModel == QAbstractItemModelPrivate::staticEmptyModel())
        return;
    static const struct {
        const char *signalName;
        const char *slotName;
    } connectionTable[] = {
        // clang-format off
        { SIGNAL(destroyed()), SLOT(_q_sourceModelDestroyed()) },
        { SIGNAL(rowsAboutToBeInserted(QModelIndex,int,int)), SLOT(_q_sourceModelRowsAboutToBeInserted(QModelIndex,int,int)) },
        { SIGNAL(rowsInserted(QModelIndex,int,int)), SLOT(_q_sourceModelRowsInserted(QModelIndex,int,int)) },
        { SIGNAL(rowsRemoved(QModelIndex,int,int)), SLOT(_q_sourceModelRowsRemoved(QModelIndex,int,int)) },
        { SIGNAL(columnsAboutToBeInserted(QModelIndex,int,int)), SLOT(_q_sourceModelColumnsAboutToBeInserted(QModelIndex,int,int)) },
        { SIGNAL(columnsInserted(QModelIndex,int,int)), SLOT(_q_sourceModelColumnsInserted(QModelIndex,int,int)) },
        { SIGNAL(columnsRemoved(QModelIndex,int,int)), SLOT(_q_sourceModelColumnsRemoved(QModelIndex,int,int)) }
        // clang-format on
    };

    if (sourceModel != currentModel) {
        if (currentModel) {
            for (const auto &c : connectionTable)
                disconnect(currentModel, c.signalName, this, c.slotName);
        }

        if (sourceModel) {
            d->model.setValueBypassingBindings(sourceModel);
            for (const auto &c : connectionTable)
                connect(sourceModel, c.signalName, this, c.slotName);
        } else {
            d->model.setValueBypassingBindings(QAbstractItemModelPrivate::staticEmptyModel());
        }
        d->model.notify();
    }
}